

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

String * __thiscall
capnp::compiler::ValueTranslator::makeNodeName
          (String *__return_storage_ptr__,ValueTranslator *this,Schema schema)

{
  String *result;
  char *__dest;
  WirePointer *pWVar1;
  size_t __n;
  bool bVar2;
  Reader RVar3;
  Reader proto;
  Schema local_80;
  Reader local_78;
  PointerReader local_48;
  
  local_80.raw = schema.raw;
  Schema::getProto(&local_78,&local_80);
  pWVar1 = (WirePointer *)0x0;
  bVar2 = local_78._reader.pointerCount == 0;
  local_48.pointer = local_78._reader.pointers;
  if (bVar2) {
    local_48.pointer = pWVar1;
  }
  local_48.nestingLimit = 0x7fffffff;
  if (!bVar2) {
    local_48.nestingLimit = local_78._reader.nestingLimit;
  }
  local_48.segment._0_4_ = 0;
  local_48.segment._4_4_ = 0;
  local_48.capTable._0_4_ = 0;
  local_48.capTable._4_4_ = 0;
  if (!bVar2) {
    local_48.segment._0_4_ = local_78._reader.segment._0_4_;
    local_48.segment._4_4_ = local_78._reader.segment._4_4_;
    local_48.capTable._0_4_ = local_78._reader.capTable._0_4_;
    local_48.capTable._4_4_ = local_78._reader.capTable._4_4_;
  }
  RVar3 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_48,(void *)0x0,0);
  if (0x5f < local_78._reader.dataSize) {
    pWVar1 = (WirePointer *)(ulong)*(uint *)((long)local_78._reader.data + 8);
  }
  kj::heapString(__return_storage_ptr__,RVar3.super_StringPtr.content.size_ + ~(ulong)pWVar1);
  __n = ~(ulong)pWVar1 + RVar3.super_StringPtr.content.size_;
  if (__n != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,RVar3.super_StringPtr.content.ptr + (long)pWVar1,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeNodeName(Schema schema) {
  schema::Node::Reader proto = schema.getProto();
  return kj::str(proto.getDisplayName().slice(proto.getDisplayNamePrefixLength()));
}